

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

Type * soul::ModuleCloner::cloneType
                 (Type *__return_storage_ptr__,StructMappings *structMappings,Type *t)

{
  Type *pTVar1;
  Type *structMappings_00;
  bool bVar2;
  bool shouldBeRef;
  mapped_type *this;
  Structure *s;
  Type local_88;
  Type local_70;
  undefined1 local_48 [8];
  Structure *local_40;
  Type local_38;
  Type *local_20;
  Type *t_local;
  StructMappings *structMappings_local;
  
  local_20 = t;
  t_local = (Type *)structMappings;
  structMappings_local = (StructMappings *)__return_storage_ptr__;
  bVar2 = Type::isStruct(t);
  pTVar1 = t_local;
  if (bVar2) {
    Type::getStruct((Type *)local_48);
    local_40 = RefCountedPtr<soul::Structure>::get((RefCountedPtr<soul::Structure> *)local_48);
    this = std::
           unordered_map<const_soul::Structure_*,_soul::RefCountedPtr<soul::Structure>,_std::hash<const_soul::Structure_*>,_std::equal_to<const_soul::Structure_*>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>_>
           ::operator[]((unordered_map<const_soul::Structure_*,_soul::RefCountedPtr<soul::Structure>,_std::hash<const_soul::Structure_*>,_std::equal_to<const_soul::Structure_*>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>_>
                         *)pTVar1,&local_40);
    s = RefCountedPtr<soul::Structure>::operator*(this);
    Type::createStruct(&local_38,s);
    bVar2 = Type::isConst(local_20);
    shouldBeRef = Type::isReference(local_20);
    Type::withConstAndRefFlags(__return_storage_ptr__,&local_38,bVar2,shouldBeRef);
    Type::~Type(&local_38);
    RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_48);
  }
  else {
    bVar2 = Type::isArray(local_20);
    structMappings_00 = t_local;
    pTVar1 = local_20;
    if (bVar2) {
      Type::getArrayElementType(&local_88,local_20);
      cloneType(&local_70,(StructMappings *)structMappings_00,&local_88);
      Type::createCopyWithNewArrayElementType(__return_storage_ptr__,pTVar1,&local_70);
      Type::~Type(&local_70);
      Type::~Type(&local_88);
    }
    else {
      Type::Type(__return_storage_ptr__,local_20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Type cloneType (StructMappings& structMappings, const Type& t)
    {
        if (t.isStruct())
            return Type::createStruct (*structMappings[t.getStruct().get()])
                     .withConstAndRefFlags (t.isConst(), t.isReference());

        if (t.isArray())
            return t.createCopyWithNewArrayElementType (cloneType (structMappings, t.getArrayElementType()));

        return t;
    }